

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaUnate.c
# Opt level: O3

int Gia_ManCheckUnate(Gia_Man_t *p,int iCiId,int iCoId)

{
  int iVar1;
  uint uVar2;
  Gia_Obj_t *pGVar3;
  uint uVar4;
  uint uVar5;
  
  if ((-1 < iCiId) && (iCiId < p->vCis->nSize)) {
    iVar1 = p->vCis->pArray[(uint)iCiId];
    if ((-1 < (long)iVar1) && (iVar1 < p->nObjs)) {
      if ((iCoId < 0) || (p->vCos->nSize <= iCoId)) goto LAB_0079015e;
      uVar2 = p->vCos->pArray[(uint)iCoId];
      if ((-1 < (long)(int)uVar2) && (uVar2 < (uint)p->nObjs)) {
        pGVar3 = p->pObjs;
        Gia_ManIncrementTravId(p);
        Gia_ManIncrementTravId(p);
        if (p->nTravIdsAlloc <= iVar1) {
          __assert_fail("Id < p->nTravIdsAlloc",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/aig/gia/gia.h"
                        ,0x260,"void Gia_ObjSetTravIdCurrentId(Gia_Man_t *, int)");
        }
        p->pTravIds[iVar1] = p->nTravIds;
        Gia_ManIncrementTravId(p);
        Gia_ManIncrementTravId(p);
        uVar4 = Gia_ManCheckUnate_rec(p,uVar2 - (*(uint *)(pGVar3 + (int)uVar2) & 0x1fffffff));
        uVar5 = uVar4;
        if ((uVar4 - 1 < 2) && (uVar5 = uVar4 ^ 3, (pGVar3[(int)uVar2].field_0x3 & 0x20) == 0)) {
          uVar5 = uVar4;
        }
        return uVar5;
      }
    }
    __assert_fail("v >= 0 && v < p->nObjs",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/aig/gia/gia.h"
                  ,0x1cc,"Gia_Obj_t *Gia_ManObj(Gia_Man_t *, int)");
  }
LAB_0079015e:
  __assert_fail("i >= 0 && i < p->nSize",
                "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/misc/vec/vecInt.h"
                ,0x1a7,"int Vec_IntEntry(Vec_Int_t *, int)");
}

Assistant:

int Gia_ManCheckUnate( Gia_Man_t * p, int iCiId, int iCoId )
{
    int Res;
    int CiObjId = Gia_ObjId(p, Gia_ManCi(p, iCiId));
    int CoObjId = Gia_ObjId(p, Gia_ManCo(p, iCoId));
    Gia_Obj_t * pCoObj = Gia_ManCo(p, iCoId);
    Gia_ManIncrementTravId( p ); // Co does not depend on Ci.
    Gia_ManIncrementTravId( p ); // Co is pos-unate in Ci
    Gia_ObjSetTravIdCurrentId( p, CiObjId );
    Gia_ManIncrementTravId( p ); // Co is neg-unate in Ci
    Gia_ManIncrementTravId( p ); // Co is not unate in Ci
    Res = Gia_ManCheckUnate_rec( p, Gia_ObjFaninId0(pCoObj, CoObjId) );
    return ((Res == 1 || Res == 2) && Gia_ObjFaninC0(pCoObj)) ? Res ^ 3 : Res;
}